

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QTextCursorPrivate>::detach_helper(QSharedDataPointer<QTextCursorPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QTextCursorPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QTextCursorPrivate> *in_RDI;
  void *in_R8;
  QTextCursorPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x7278db);
  Qt::totally_ordered_wrapper<QTextCursorPrivate_*>::get
            ((totally_ordered_wrapper<QTextCursorPrivate_*> *)in_RDI);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x7278ed);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QTextCursorPrivate_*>::get
                          ((totally_ordered_wrapper<QTextCursorPrivate_*> *)in_RDI),
     this_00 != (QTextCursorPrivate *)0x0)) {
    QTextCursorPrivate::~QTextCursorPrivate(this_00);
    operator_delete(this_00,0x30);
  }
  Qt::totally_ordered_wrapper<QTextCursorPrivate_*>::reset
            ((totally_ordered_wrapper<QTextCursorPrivate_*> *)in_RDI,
             (QTextCursorPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}